

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::GenericTrack::GenericTrack(GenericTrack *this,Dictionary *d)

{
  Dictionary *d_local;
  GenericTrack *this_local;
  
  InterchangeObject::InterchangeObject(&this->super_InterchangeObject,d);
  (this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__GenericTrack_0033a050;
  this->TrackID = 0;
  this->TrackNumber = 0;
  optional_property<ASDCP::MXF::UTF16String>::optional_property(&this->TrackName);
  optional_property<Kumu::UUID>::optional_property(&this->Sequence);
  return;
}

Assistant:

GenericTrack::GenericTrack(const Dictionary* d) : InterchangeObject(d), TrackID(0), TrackNumber(0) {}